

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_composite_constants(CompilerHLSL *this)

{
  uint id;
  bool bVar1;
  bool bVar2;
  SPIRConstant *c;
  SPIRType *type;
  long lVar3;
  LoopLock local_b0;
  ParsedIR *local_a8;
  TypedID<(spirv_cross::Types)0> *local_a0;
  long local_98;
  string name;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_a8);
  local_a0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_98 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
  lVar3 = 0;
  bVar2 = false;
  do {
    if (local_98 == lVar3) {
      ParsedIR::LoopLock::~LoopLock(&local_b0);
      if (bVar2) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x272bdf);
      }
      return;
    }
    id = *(uint *)((long)&local_a0->id + lVar3);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeConstant) {
      c = ParsedIR::get<spirv_cross::SPIRConstant>(local_a8,id);
      if (c->specialization == false) {
        type = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(c->super_IVariant).field_0xc);
        if (type->basetype == Struct) {
          bVar1 = Compiler::is_builtin_type((Compiler *)this,type);
          if (!bVar1) {
            if (type->basetype != Struct) goto LAB_0018ed25;
            goto LAB_0018ed30;
          }
        }
        else {
LAB_0018ed25:
          if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
LAB_0018ed30:
            CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(c->super_IVariant).self.id);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&name,this,(ulong)(c->super_IVariant).self.id,1);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&local_50,this,type);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_70,&this->super_CompilerGLSL,c,false,false);
            CompilerGLSL::
            statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_50,
                       (char (*) [4])0x297dc7,&local_70,(char (*) [2])0x297c5b);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_50);
            ::std::__cxx11::string::~string((string *)&name);
            bVar2 = true;
          }
        }
      }
    }
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

void CompilerHLSL::emit_composite_constants()
{
	// HLSL cannot declare structs or arrays inline, so we must move them out to
	// global constants directly.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);

		if (type.basetype == SPIRType::Struct && is_builtin_type(type))
			return;

		if (type.basetype == SPIRType::Struct || !type.array.empty())
		{
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}